

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void ZSTD_buildFSETable(ZSTD_seqSymbol *dt,short *normalizedCounter,uint maxSymbolValue,
                       U32 *baseValue,U32 *nbAdditionalBits,uint tableLog)

{
  short sVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  undefined4 uVar5;
  ulong uVar6;
  uint uVar7;
  ushort uVar8;
  int iVar9;
  ulong uVar10;
  U16 symbolNext [53];
  ushort local_a8 [60];
  
  bVar2 = (byte)tableLog;
  uVar7 = 1 << (bVar2 & 0x1f);
  if (0x34 < maxSymbolValue) {
    __assert_fail("maxSymbolValue <= MaxSeq",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x6236,
                  "void ZSTD_buildFSETable(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U32 *, unsigned int)"
                 );
  }
  if (9 < tableLog) {
    __assert_fail("tableLog <= MaxFSELog",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x6237,
                  "void ZSTD_buildFSETable(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U32 *, unsigned int)"
                 );
  }
  uVar4 = (uint)(0x8000 << (bVar2 & 0x1f)) >> 0x10;
  uVar5 = 1;
  uVar10 = 0;
  uVar6 = (ulong)(uVar7 - 1);
  do {
    uVar8 = normalizedCounter[uVar10];
    if (uVar8 == 0xffff) {
      dt[uVar6 + 1].baseValue = (U32)uVar10;
      uVar8 = 1;
      uVar6 = (ulong)((int)uVar6 - 1);
    }
    else {
      if ((short)uVar8 < 0) {
        __assert_fail("normalizedCounter[s]>=0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x6245,
                      "void ZSTD_buildFSETable(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U32 *, unsigned int)"
                     );
      }
      if (uVar4 < uVar8 || uVar4 == uVar8) {
        uVar5 = 0;
      }
    }
    local_a8[uVar10] = uVar8;
    uVar10 = uVar10 + 1;
  } while (maxSymbolValue + 1 != uVar10);
  dt->nextState = (short)uVar5;
  dt->nbAdditionalBits = (char)((uint)uVar5 >> 0x10);
  dt->nbBits = (char)((uint)uVar5 >> 0x18);
  dt->baseValue = tableLog;
  uVar10 = 0;
  uVar4 = 0;
  do {
    sVar1 = normalizedCounter[uVar10];
    if (0 < sVar1) {
      iVar9 = 0;
      do {
        dt[(ulong)uVar4 + 1].baseValue = (U32)uVar10;
        do {
          uVar4 = uVar4 + (uVar7 >> 3) + (uVar7 >> 1) + 3 & uVar7 - 1;
        } while ((uint)uVar6 < uVar4);
        iVar9 = iVar9 + 1;
      } while (iVar9 != sVar1);
    }
    uVar10 = uVar10 + 1;
  } while (uVar10 != maxSymbolValue + 1);
  if (uVar4 != 0) {
    __assert_fail("position == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x6256,
                  "void ZSTD_buildFSETable(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U32 *, unsigned int)"
                 );
  }
  uVar6 = 0;
  while( true ) {
    uVar4 = dt[uVar6 + 1].baseValue;
    uVar8 = local_a8[uVar4];
    local_a8[uVar4] = uVar8 + 1;
    if (uVar8 == 0) {
      __assert_fail("val != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x5a1,"unsigned int BIT_highbit32(U32)");
    }
    iVar9 = 0x1f;
    if (uVar8 != 0) {
      for (; uVar8 >> iVar9 == 0; iVar9 = iVar9 + -1) {
      }
    }
    bVar3 = bVar2 - (char)iVar9;
    dt[uVar6 + 1].nbBits = bVar3;
    dt[uVar6 + 1].nextState = (uVar8 << (bVar3 & 0x1f)) - (short)uVar7;
    if (0xfe < nbAdditionalBits[uVar4]) break;
    dt[uVar6 + 1].nbAdditionalBits = (BYTE)nbAdditionalBits[uVar4];
    dt[uVar6 + 1].baseValue = baseValue[uVar4];
    uVar6 = uVar6 + 1;
    if (uVar7 == uVar6) {
      return;
    }
  }
  __assert_fail("nbAdditionalBits[symbol] < 255",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x6260,
                "void ZSTD_buildFSETable(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U32 *, unsigned int)"
               );
}

Assistant:

void
ZSTD_buildFSETable(ZSTD_seqSymbol* dt,
            const short* normalizedCounter, unsigned maxSymbolValue,
            const U32* baseValue, const U32* nbAdditionalBits,
            unsigned tableLog)
{
    ZSTD_seqSymbol* const tableDecode = dt+1;
    U16 symbolNext[MaxSeq+1];

    U32 const maxSV1 = maxSymbolValue + 1;
    U32 const tableSize = 1 << tableLog;
    U32 highThreshold = tableSize-1;

    /* Sanity Checks */
    assert(maxSymbolValue <= MaxSeq);
    assert(tableLog <= MaxFSELog);

    /* Init, lay down lowprob symbols */
    {   ZSTD_seqSymbol_header DTableH;
        DTableH.tableLog = tableLog;
        DTableH.fastMode = 1;
        {   S16 const largeLimit= (S16)(1 << (tableLog-1));
            U32 s;
            for (s=0; s<maxSV1; s++) {
                if (normalizedCounter[s]==-1) {
                    tableDecode[highThreshold--].baseValue = s;
                    symbolNext[s] = 1;
                } else {
                    if (normalizedCounter[s] >= largeLimit) DTableH.fastMode=0;
                    assert(normalizedCounter[s]>=0);
                    symbolNext[s] = (U16)normalizedCounter[s];
        }   }   }
        memcpy(dt, &DTableH, sizeof(DTableH));
    }

    /* Spread symbols */
    {   U32 const tableMask = tableSize-1;
        U32 const step = FSE_TABLESTEP(tableSize);
        U32 s, position = 0;
        for (s=0; s<maxSV1; s++) {
            int i;
            for (i=0; i<normalizedCounter[s]; i++) {
                tableDecode[position].baseValue = s;
                position = (position + step) & tableMask;
                while (position > highThreshold) position = (position + step) & tableMask;   /* lowprob area */
        }   }
        assert(position == 0); /* position must reach all cells once, otherwise normalizedCounter is incorrect */
    }

    /* Build Decoding table */
    {   U32 u;
        for (u=0; u<tableSize; u++) {
            U32 const symbol = tableDecode[u].baseValue;
            U32 const nextState = symbolNext[symbol]++;
            tableDecode[u].nbBits = (BYTE) (tableLog - BIT_highbit32(nextState) );
            tableDecode[u].nextState = (U16) ( (nextState << tableDecode[u].nbBits) - tableSize);
            assert(nbAdditionalBits[symbol] < 255);
            tableDecode[u].nbAdditionalBits = (BYTE)nbAdditionalBits[symbol];
            tableDecode[u].baseValue = baseValue[symbol];
    }   }
}